

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptor::InternalDependenciesOnceInit(FileDescriptor *this)

{
  DescriptorPool *this_00;
  size_t sVar1;
  size_t sVar2;
  FileDescriptor *pFVar3;
  int iVar4;
  long lVar5;
  char *name;
  once_flag *__s;
  string_view name_00;
  
  if (this->finished_building_ != false) {
    iVar4 = this->dependency_count_;
    if (0 < iVar4) {
      __s = this->dependencies_once_ + 1;
      lVar5 = 0;
      do {
        sVar1 = strlen((char *)__s);
        if ((char)(__s->control_).super___atomic_base<unsigned_int>._M_i != '\0') {
          this_00 = this->pool_;
          sVar2 = strlen((char *)__s);
          name_00._M_str = (char *)__s;
          name_00._M_len = sVar2;
          pFVar3 = DescriptorPool::FindFileByName(this_00,name_00);
          this->dependencies_[lVar5] = pFVar3;
          iVar4 = this->dependency_count_;
        }
        __s = (once_flag *)
              ((long)&(__s->control_).super___atomic_base<unsigned_int>._M_i + sVar1 + 1);
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar4);
    }
    return;
  }
  InternalDependenciesOnceInit();
}

Assistant:

void FileDescriptor::InternalDependenciesOnceInit() const {
  ABSL_CHECK(finished_building_ == true);
  const char* names_ptr = reinterpret_cast<const char*>(dependencies_once_ + 1);
  for (int i = 0; i < dependency_count(); i++) {
    const char* name = names_ptr;
    names_ptr += strlen(name) + 1;
    if (name[0] != '\0') {
      dependencies_[i] = pool_->FindFileByName(name);
    }
  }
}